

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

vector<BigInt,_std::allocator<BigInt>_> * __thiscall
BigInt::div_and_mod(vector<BigInt,_std::allocator<BigInt>_> *__return_storage_ptr__,BigInt *this,
                   BigInt *b)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_00;
  long lVar4;
  BigInt *this_01;
  initializer_list<BigInt> __l;
  initializer_list<BigInt> __l_00;
  initializer_list<BigInt> __l_01;
  BigInt local_230;
  BigInt local_210;
  BigInt j;
  BigInt divided;
  BigInt ans;
  BigInt one;
  BigInt temp;
  BigInt divisor;
  BigInt local_130;
  BigInt local_110;
  BigInt local_f0;
  BigInt local_d0;
  BigInt local_b0;
  BigInt local_90;
  BigInt local_70;
  BigInt local_50;
  
  BigInt(&local_230,0);
  bVar1 = operator==(b,&local_230);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_230);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ERROR zero, 0 could not be the divisor");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  absolute(&local_230,this);
  absolute(&j,b);
  bVar1 = operator<(&local_230,&j);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&j);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_230);
  if (bVar1) {
    BigInt(&j,this);
    BigInt(&local_230,0);
    BigInt(&local_210,&j);
    __l._M_len = 2;
    __l._M_array = &local_230;
    std::vector<BigInt,_std::allocator<BigInt>_>::vector
              (__return_storage_ptr__,__l,(allocator_type *)&one);
    lVar4 = 0x20;
    do {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)
                 ((long)&local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
  }
  else {
    bVar1 = operator==(this,b);
    if (bVar1) {
      BigInt(&local_230,1);
      BigInt(&local_210,0);
      __l_00._M_len = 2;
      __l_00._M_array = &local_230;
      std::vector<BigInt,_std::allocator<BigInt>_>::vector
                (__return_storage_ptr__,__l_00,(allocator_type *)&j);
      lVar4 = 0x20;
      do {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)
                   ((long)&local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      return __return_storage_ptr__;
    }
    iVar2 = get_real_length(this);
    iVar3 = get_real_length(b);
    BigInt(&j,0);
    BigInt(&one,1);
    BigInt(&ans,1);
    absolute(&divided,this);
    absolute(&divisor,b);
    BigInt(&temp,1);
    for (iVar2 = iVar2 - iVar3; -1 < iVar2; iVar2 = iVar2 + -1) {
      BigInt(&local_110,0);
      operator=(&j,&local_110);
      this_01 = &local_110;
      while( true ) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)this_01);
        multiply(&local_70,&j,&divisor);
        multi_ten(&local_230,&local_70,iVar2);
        bVar1 = operator>=(&divided,&local_230);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_230);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
        if (!bVar1) break;
        add(&local_50,&j,&one);
        operator=(&j,&local_50);
        this_01 = &local_50;
      }
      operator-(&local_90,&j,&one);
      operator=(&j,&local_90);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
      multi_ten(&local_b0,&j,iVar2);
      operator=(&temp,&local_b0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
      add(&local_d0,&ans,&temp);
      operator=(&ans,&local_d0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_d0);
      multiply(&local_230,&divisor,&temp);
      operator-(&local_f0,&divided,&local_230);
      operator=(&divided,&local_f0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_f0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_230);
    }
    operator-(&local_130,&ans,&one);
    operator=(&ans,&local_130);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_130);
    ans.sign = (int)((b->sign == 0) != (this->sign == 0));
    *ans.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = ans.sign;
    divided.sign = (int)(this->sign != 0);
    *divided.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = divided.sign;
    BigInt(&local_230,&ans);
    BigInt(&local_210,&divided);
    __l_01._M_len = 2;
    __l_01._M_array = &local_230;
    std::vector<BigInt,_std::allocator<BigInt>_>::vector
              (__return_storage_ptr__,__l_01,(allocator_type *)&local_70);
    lVar4 = 0x20;
    do {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)
                 ((long)&local_230.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&temp);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&divisor);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&divided);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&ans);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&one);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&j);
  return __return_storage_ptr__;
}

Assistant:

vector<BigInt> BigInt::div_and_mod(BigInt& b) {
    if (b == 0) {
        throw runtime_error("ERROR zero, 0 could not be the divisor");
    }
    if (this->absolute() < b.absolute()) {
        BigInt temp = *this;
        return vector<BigInt>{BigInt(0), temp};
    }
    if (*this == b) {
        return vector<BigInt>{BigInt(1), BigInt(0)};
    }
    int cost = this->get_real_length();
    if (cost < 20 && false) {
        string aa = this->to_string();
        string bb = b.to_string();
        long long int aint = stoll(aa, nullptr, 10);
        long long int bint = stoll(bb, nullptr, 10);
        return vector<BigInt>{BigInt(aint / bint), BigInt(aint % bint)};
    }
    cost -= b.get_real_length();
    BigInt j(0);
    BigInt one(1);
    BigInt ans(1);
    BigInt divided = this->absolute();
    BigInt divisor = b.absolute();
    BigInt temp(1);
    while (cost >= 0) {
        j = 0;
        while (divided >= (j * divisor).multi_ten(cost)) {
            j = j + one;
        }
        j = j - one;
        temp = j.multi_ten(cost);
        ans = ans + temp;
        divided = divided - divisor * temp;
        cost -= 1;
    }
    ans = ans - one;
    ans.set_sign(this->get_positive_sign() == b.get_positive_sign() ? true : false);
    divided.set_sign(this->get_positive_sign());
    return vector<BigInt>{ans, divided};
}